

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

void __thiscall stk::FileWrite::closeMatFile(FileWrite *this)

{
  size_t sVar1;
  long lVar2;
  SINT32 headsize;
  int local_20;
  int local_1c;
  
  fseek((FILE *)this->fd_,0xe4,0);
  fwrite(&this->frameCounter_,4,1,(FILE *)this->fd_);
  fseek((FILE *)this->fd_,0xc4,0);
  sVar1 = fread(&local_20,4,1,(FILE *)this->fd_);
  if (sVar1 == 1) {
    lVar2 = (long)local_20;
    local_20 = local_20 + (int)this->frameCounter_ * this->channels_ * 8;
    fseek((FILE *)this->fd_,0xc4,0);
    fwrite(&local_20,4,1,(FILE *)this->fd_);
    fseek((FILE *)this->fd_,lVar2 + 0xc4,0);
    local_1c = (int)this->frameCounter_ * this->channels_ * 8;
    fwrite(&local_1c,4,1,(FILE *)this->fd_);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,
               "FileWrite: could not read MAT-file header size.",0x2f);
    Stk::handleError(&this->super_Stk,WARNING);
  }
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeMatFile( void )
{
  fseek(fd_, 228, SEEK_SET); // jump to number of columns
  fwrite(&frameCounter_, 4, 1, fd_);

  SINT32 headsize, temp;
  fseek(fd_, 196, SEEK_SET);  // jump to header size
  if (fread(&headsize, 4, 1, fd_) != 1) {
      oStream_ << "FileWrite: could not read MAT-file header size.";
      handleError( StkError::WARNING );
      goto close_file;
  }

  temp = headsize;
  headsize += (SINT32) (frameCounter_ * 8 * channels_);
  fseek(fd_, 196, SEEK_SET);
  // Write file size (minus some header info)
  fwrite(&headsize, 4, 1, fd_);

  fseek(fd_, temp+196, SEEK_SET); // jump to data size (in bytes)
  temp = (SINT32) (frameCounter_ * 8 * channels_);
  fwrite(&temp, 4, 1, fd_);

close_file:
  fclose(fd_);
}